

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

void qpixl::frqi::sfwht<std::vector<float,std::allocator<float>>>
               (vector<float,_std::allocator<float>_> *a)

{
  float fVar1;
  float fVar2;
  pointer pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pfVar3 = (a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar4 = (long)(a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar3 >> 2;
  uVar5 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (1 < uVar5 >> 0x38) {
    __assert_fail("qpixl::ispow2( n )",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/include/qpixl/frqi/util.hpp"
                  ,0x1a,"void qpixl::frqi::sfwht(V &) [V = std::vector<float>]");
  }
  if ((char)(uVar5 >> 0x38) == '\x01') {
    if (1 < uVar4) {
      uVar5 = 1;
      do {
        uVar6 = 0;
        do {
          if ((uVar6 & uVar5) == 0) {
            fVar1 = pfVar3[uVar6];
            fVar2 = pfVar3[uVar5 + uVar6];
            pfVar3[uVar6] = (fVar1 + fVar2) * 0.5;
            pfVar3[uVar5 + uVar6] = (fVar1 - fVar2) * 0.5;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
        uVar5 = uVar5 * 2;
      } while (uVar5 < uVar4);
    }
    return;
  }
  __assert_fail("std::popcount( x ) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/include/qpixl/util.hpp"
                ,0x13,"size_t qpixl::ilog2(const size_t)");
}

Assistant:

void sfwht( V& a ) {
    using T = typename V::value_type ;
    size_t n = a.size() ;
    assert( qpixl::ispow2( n ) ) ;
    size_t k = qpixl::ilog2( n ) ;

    for ( size_t j = 1; j < n; j*=2 ) {
      #pragma omp parallel for
      for ( size_t i = 0; i < n; i++ ) {
        if ( ( i & j ) == 0 ) {
          const size_t j1 = i + j ;
          const T x = a[i] ;
          const T y = a[j1] ;

          a[i]  = ( x + y ) / T(2) ;
          a[j1] = ( x - y ) / T(2) ;
        }
      }
    }
  }